

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcrcell.c
# Opt level: O0

void freelistcell(LispPTR cell)

{
  uint uVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  uint local_28;
  uint celloffset;
  uint prior;
  uint offset;
  ConsCell *cell68k;
  conspage *pbase;
  LispPTR cell_local;
  
  pLVar2 = NativeAligned4FromLAddr(cell);
  pLVar3 = NativeAligned4FromLPage((cell & 0xfffff00) >> 8);
  uVar1 = cell & 0xff;
  if (uVar1 < 8) {
    error("freeing CONS cell that\'s really freelist ptr");
  }
  if (pLVar3[2] >> 0x18 == 0) {
    pLVar3[2] = pLVar3[2] & 0xff00ffff | uVar1 << 0x10;
    *(uint *)((long)pLVar3 + (ulong)uVar1 * 2) =
         *(uint *)((long)pLVar3 + (ulong)uVar1 * 2) & 0xffffff;
  }
  else {
    local_28 = 0;
    for (celloffset = pLVar3[2] >> 0x10 & 0xff;
        (celloffset != 0 && ((uVar1 ^ 6) <= (celloffset ^ 6)));
        celloffset = *(uint *)((long)pLVar3 + (ulong)celloffset * 2) >> 0x18) {
      local_28 = celloffset;
    }
    if (local_28 == 0) {
      pLVar3[2] = pLVar3[2] & 0xff00ffff | uVar1 << 0x10;
    }
    else {
      *(uint *)((long)pLVar3 + (ulong)local_28 * 2) =
           *(uint *)((long)pLVar3 + (ulong)local_28 * 2) & 0xffffff | uVar1 << 0x18;
    }
    *pLVar2 = *pLVar2 & 0xffffff | celloffset << 0x18;
  }
  uVar1 = (pLVar3[2] >> 0x18) + 1 & 0xff;
  pLVar3[2] = pLVar3[2] & 0xffffff | uVar1 << 0x18;
  if ((0x20 < uVar1) && (pLVar3[3] == 0xffffffff)) {
    pLVar3[3] = ListpDTD->dtd_nextpage;
    ListpDTD->dtd_nextpage = (cell & 0xfffff00) >> 8;
  }
  return;
}

Assistant:

void freelistcell(LispPTR cell) {
  struct conspage *pbase;
  ConsCell *cell68k;
  unsigned int offset, prior, celloffset;

  cell68k = (ConsCell *)NativeAligned4FromLAddr(cell);
  pbase = (struct conspage *)NativeAligned4FromLPage(POINTER_PAGE(cell));
  celloffset = (LispPTR)cell & 0xFF;
#ifdef NEWCDRCODING
  if (celloffset < 8) error("freeing CONS cell that's really freelist ptr");
#endif /* NEWCDRCODING */

  if (pbase->count) /* There are free cells on the page already */
  {
    prior = 0;

    for (offset = pbase->next_cell; offset; offset = FREECONS(pbase, offset)->next_free) {
#ifdef NEWCDRCODING
      if ((6 ^ offset) < (6 ^ celloffset))
#else
      if (offset < celloffset)
#endif /* NEWCDRCODING */
      {
        break;
      }
      prior = offset;
    }

    if (prior)
      FREECONS(pbase, prior)->next_free = celloffset;
    else
      pbase->next_cell = celloffset;
    ((freecons *)cell68k)->next_free = offset;
  } else /* NO FREE CELLS.  Just replace next_free. */
  {
    pbase->next_cell = celloffset;
    FREECONS(pbase, celloffset)->next_free = 0; /* And this is end of the chain */
  }

  if ((++pbase->count > 32) && (pbase->next_page == CONSPAGE_LAST)) {
    pbase->next_page = ListpDTD->dtd_nextpage;
    ListpDTD->dtd_nextpage = POINTER_PAGE(cell);
  }
}